

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O2

uint __thiscall
Assimp::glTF2Exporter::ExportNode(glTF2Exporter *this,aiNode *n,Ref<glTF2::Node> *parent)

{
  Asset *this_00;
  Node *pNVar1;
  bool bVar2;
  vector<glTF2::Node_*,_std::allocator<glTF2::Node_*>_> *pvVar3;
  uint uVar4;
  uint i;
  ulong uVar5;
  uint i_1;
  Ref<glTF2::Node> RVar6;
  string name;
  Ref<glTF2::Mesh> local_80;
  string local_70;
  string local_50;
  
  this_00 = (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,(n->mName).data,(allocator<char> *)&local_80);
  glTF2::Asset::FindUniqueID(&local_50,this_00,&local_70,"node");
  std::__cxx11::string::~string((string *)&local_70);
  RVar6 = glTF2::LazyDict<glTF2::Node>::Create
                    (&((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->nodes,local_50._M_dataplus._M_p);
  pvVar3 = RVar6.vector;
  uVar4 = RVar6.index;
  pNVar1 = (pvVar3->super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar4];
  (pNVar1->parent).index = parent->index;
  (pNVar1->parent).vector = parent->vector;
  local_70._M_dataplus._M_p = (pointer)pvVar3;
  local_70._M_string_length._0_4_ = uVar4;
  std::__cxx11::string::_M_assign
            ((string *)
             &((pvVar3->super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar4]->super_Object).name);
  bVar2 = aiMatrix4x4t<float>::IsIdentity(&n->mTransformation);
  if (!bVar2) {
    ((pvVar3->super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>)._M_impl.
     super__Vector_impl_data._M_start[uVar4]->matrix).isPresent = true;
    CopyValue(&n->mTransformation,
              ((pvVar3->super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar4]->matrix).value);
  }
  for (uVar5 = 0; uVar5 < n->mNumMeshes; uVar5 = uVar5 + 1) {
    local_80.index = n->mMeshes[uVar5];
    local_80.vector =
         &(((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          meshes).mObjs;
    std::vector<glTF2::Ref<glTF2::Mesh>,std::allocator<glTF2::Ref<glTF2::Mesh>>>::
    emplace_back<glTF2::Ref<glTF2::Mesh>>
              ((vector<glTF2::Ref<glTF2::Mesh>,std::allocator<glTF2::Ref<glTF2::Mesh>>> *)
               &(pvVar3->super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar4]->meshes,&local_80);
  }
  for (uVar5 = 0; uVar5 < n->mNumChildren; uVar5 = uVar5 + 1) {
    local_80.index = ExportNode(this,n->mChildren[uVar5],(Ref<glTF2::Node> *)&local_70);
    local_80.vector =
         (vector<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_> *)
         &(((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          nodes).mObjs;
    std::vector<glTF2::Ref<glTF2::Node>,std::allocator<glTF2::Ref<glTF2::Node>>>::
    emplace_back<glTF2::Ref<glTF2::Node>>
              ((vector<glTF2::Ref<glTF2::Node>,std::allocator<glTF2::Ref<glTF2::Node>>> *)
               &(pvVar3->super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar4]->children,(Ref<glTF2::Node> *)&local_80);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return uVar4;
}

Assistant:

unsigned int glTF2Exporter::ExportNode(const aiNode* n, Ref<Node>& parent)
{
    std::string name = mAsset->FindUniqueID(n->mName.C_Str(), "node");
    Ref<Node> node = mAsset->nodes.Create(name);

    node->parent = parent;
    node->name = name;

    if (!n->mTransformation.IsIdentity()) {
        node->matrix.isPresent = true;
        CopyValue(n->mTransformation, node->matrix.value);
    }

    for (unsigned int i = 0; i < n->mNumMeshes; ++i) {
        node->meshes.push_back(mAsset->meshes.Get(n->mMeshes[i]));
    }

    for (unsigned int i = 0; i < n->mNumChildren; ++i) {
        unsigned int idx = ExportNode(n->mChildren[i], node);
        node->children.push_back(mAsset->nodes.Get(idx));
    }

    return node.GetIndex();
}